

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> * __thiscall
pybind11::class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var>::
def_property<kratos::PortDirection(kratos::Port::*)()const>
          (class_<kratos::Port,std::shared_ptr<kratos::Port>,kratos::Var> *this,char *name,
          offset_in_Var_to_subr *fget,cpp_function *fset)

{
  class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *pcVar1;
  cpp_function local_38;
  return_value_policy local_29;
  
  cpp_function::cpp_function<kratos::PortDirection,kratos::Port>(&local_38,*fget);
  local_29 = reference_internal;
  pcVar1 = class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var>::
           def_property<pybind11::return_value_policy>
                     ((class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var> *)this,name,
                      &local_38,fset,&local_29);
  object::~object((object *)&local_38);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }